

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O2

void __thiscall slang::ast::Compilation::forceElaborate(Compilation *this,Symbol *symbol)

{
  uint uVar1;
  DiagnosticVisitor visitor;
  DiagnosticVisitor local_1e0;
  
  uVar1 = (this->options).errorLimit;
  DiagnosticVisitor::DiagnosticVisitor(&local_1e0,this,&this->numErrors,-(uint)(uVar1 == 0) | uVar1)
  ;
  local_1e0.visitInstances = false;
  Symbol::visit<slang::ast::DiagnosticVisitor&>(symbol,&local_1e0);
  DiagnosticVisitor::~DiagnosticVisitor(&local_1e0);
  return;
}

Assistant:

void Compilation::forceElaborate(const Symbol& symbol) {
    SLANG_ASSERT(!isFrozen());
    DiagnosticVisitor visitor(*this, numErrors,
                              options.errorLimit == 0 ? UINT32_MAX : options.errorLimit);
    visitor.visitInstances = false;
    symbol.visit(visitor);
}